

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHClientRandomsMatch_Test::TestBody
          (SSLTest_ECHClientRandomsMatch_Test *this)

{
  bool bVar1;
  SSL_METHOD *method;
  char *pcVar2;
  pointer psVar3;
  pointer psVar4;
  SSL_METHOD *meth;
  pointer server_ctx_00;
  pointer psVar5;
  pointer server_00;
  char *in_R9;
  AssertHelper local_3c8;
  Message local_3c0;
  Span<const_unsigned_char> local_3b8;
  Bytes local_3a8;
  Span<const_unsigned_char> local_398;
  Bytes local_388;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_2;
  Message local_360;
  size_t local_358;
  unsigned_long local_350;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_1;
  Message local_330;
  size_t local_328;
  unsigned_long local_320;
  undefined1 local_318 [8];
  AssertionResult gtest_ar;
  uint8_t client_random2 [32];
  uint8_t client_random1 [32];
  string local_2c0;
  AssertHelper local_2a0;
  Message local_298;
  int local_28c;
  undefined1 local_288 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_258;
  Message local_250;
  int local_244;
  undefined1 local_240 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_210;
  Message local_208;
  bool local_1f9;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1c8;
  Message local_1c0;
  bool local_1b1;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_180;
  Message local_178;
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__4;
  UniquePtr<SSL> server;
  UniquePtr<SSL> client;
  AssertHelper local_128;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<SSL_CTX> client_ctx;
  AssertHelper local_e0;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<SSL_ECH_KEYS> keys;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<SSL_CTX> server_ctx;
  SSLTest_ECHClientRandomsMatch_Test *this_local;
  
  method = TLS_method();
  CreateContextWithTestCertificate((anon_unknown_0 *)&gtest_ar_.message_,method);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)"server_ctx","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x855,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    MakeTestECHKeys((anon_unknown_0 *)&gtest_ar__1.message_,'\x01');
    testing::AssertionResult::
    AssertionResult<std::unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,
               (unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,
               (type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_88,(AssertionResult *)0x4dabc5,
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x857,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      psVar4 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                          &gtest_ar__1.message_);
      local_cc = SSL_CTX_set1_ech_keys(psVar3,psVar4);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_c8,&local_cc,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&client_ctx,(internal *)local_c8,
                   (AssertionResult *)"SSL_CTX_set1_ech_keys(server_ctx.get(), keys.get())","false",
                   "true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x858,pcVar2);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&client_ctx);
        testing::Message::~Message(&local_d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
      if (bVar1) {
        meth = (SSL_METHOD *)TLS_method();
        psVar3 = (pointer)SSL_CTX_new(meth);
        std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&gtest_ar__3.message_,psVar3);
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_118,
                   (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                   (type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
        if (!bVar1) {
          testing::Message::Message(&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&client,(internal *)local_118,(AssertionResult *)"client_ctx","false"
                     ,"true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x85b,pcVar2);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          std::__cxx11::string::~string((string *)&client);
          testing::Message::~Message(&local_120);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
        if (bVar1) {
          std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&server);
          std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&gtest_ar__4.message_);
          psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                              &gtest_ar__3.message_);
          server_ctx_00 =
               std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
          local_169 = CreateClientAndServer
                                (&server,(UniquePtr<SSL> *)&gtest_ar__4.message_,psVar3,
                                 server_ctx_00);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_168,&local_169,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
          if (!bVar1) {
            testing::Message::Message(&local_178);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_168,
                       (AssertionResult *)
                       "CreateClientAndServer(&client, &server, client_ctx.get(), server_ctx.get())"
                       ,"false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_180,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x85e,pcVar2);
            testing::internal::AssertHelper::operator=(&local_180,&local_178);
            testing::internal::AssertHelper::~AssertHelper(&local_180);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_178);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
          if (bVar1) {
            psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
            psVar4 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                                &gtest_ar__1.message_);
            local_1b1 = InstallECHConfigList(psVar5,psVar4);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_1b0,&local_1b1,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
            if (!bVar1) {
              testing::Message::Message(&local_1c0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_1b0,
                         (AssertionResult *)"InstallECHConfigList(client.get(), keys.get())","false"
                         ,"true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1c8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x85f,pcVar2);
              testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
              testing::internal::AssertHelper::~AssertHelper(&local_1c8);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_1c0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
            if (bVar1) {
              psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
              server_00 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__4.message_);
              local_1f9 = CompleteHandshakes(psVar5,server_00);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_1f8,&local_1f9,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
              if (!bVar1) {
                testing::Message::Message(&local_208);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__7.message_,(internal *)local_1f8,
                           (AssertionResult *)"CompleteHandshakes(client.get(), server.get())",
                           "false","true",in_R9);
                pcVar2 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_210,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x860,pcVar2);
                testing::internal::AssertHelper::operator=(&local_210,&local_208);
                testing::internal::AssertHelper::~AssertHelper(&local_210);
                std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_208);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
              if (bVar1) {
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
                local_244 = SSL_ech_accepted(psVar5);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_240,&local_244,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_240);
                if (!bVar1) {
                  testing::Message::Message(&local_250);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__8.message_,(internal *)local_240,
                             (AssertionResult *)"SSL_ech_accepted(client.get())","false","true",
                             in_R9);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_258,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x862,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_258,&local_250);
                  testing::internal::AssertHelper::~AssertHelper(&local_258);
                  std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                  testing::Message::~Message(&local_250);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__4.message_);
                local_28c = SSL_ech_accepted(psVar5);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_288,&local_28c,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_288);
                if (!bVar1) {
                  testing::Message::Message(&local_298);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_2c0,(internal *)local_288,
                             (AssertionResult *)"SSL_ech_accepted(server.get())","false","true",
                             in_R9);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_2a0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x863,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
                  testing::internal::AssertHelper::~AssertHelper(&local_2a0);
                  std::__cxx11::string::~string((string *)&local_2c0);
                  testing::Message::~Message(&local_298);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
                local_320 = 0x20;
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
                local_328 = SSL_get_client_random(psVar5,client_random2 + 0x18,0x20);
                testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                          ((EqHelper *)local_318,"sizeof(client_random1)",
                           "SSL_get_client_random(client.get(), client_random1, sizeof(client_random1))"
                           ,&local_320,&local_328);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_318);
                if (!bVar1) {
                  testing::Message::Message(&local_330);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x86c,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_1.message_,&local_330);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_1.message_);
                  testing::Message::~Message(&local_330);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
                if (bVar1) {
                  local_350 = 0x20;
                  psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                      &gtest_ar__4.message_);
                  local_358 = SSL_get_client_random(psVar5,(uint8_t *)&gtest_ar.message_,0x20);
                  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                            ((EqHelper *)local_348,"sizeof(client_random2)",
                             "SSL_get_client_random(server.get(), client_random2, sizeof(client_random2))"
                             ,&local_350,&local_358);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_348);
                  if (!bVar1) {
                    testing::Message::Message(&local_360);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_348)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x86f,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_2.message_,&local_360);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_2.message_);
                    testing::Message::~Message(&local_360);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
                  if (bVar1) {
                    Span<unsigned_char_const>::Span<32ul>
                              ((Span<unsigned_char_const> *)&local_398,
                               (uchar (*) [32])(client_random2 + 0x18));
                    Bytes::Bytes(&local_388,local_398);
                    Span<unsigned_char_const>::Span<32ul>
                              ((Span<unsigned_char_const> *)&local_3b8,
                               (uchar (*) [32])&gtest_ar.message_);
                    Bytes::Bytes(&local_3a8,local_3b8);
                    testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                              ((EqHelper *)local_378,"Bytes(client_random1)","Bytes(client_random2)"
                               ,&local_388,&local_3a8);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_378);
                    if (!bVar1) {
                      testing::Message::Message(&local_3c0);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_378);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_3c8,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x870,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
                      testing::internal::AssertHelper::~AssertHelper(&local_3c8);
                      testing::Message::~Message(&local_3c0);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
                  }
                }
              }
            }
          }
          std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_);
          std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
        }
        std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
      }
    }
    std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SSLTest, ECHClientRandomsMatch) {
  bssl::UniquePtr<SSL_CTX> server_ctx =
      CreateContextWithTestCertificate(TLS_method());
  ASSERT_TRUE(server_ctx);
  bssl::UniquePtr<SSL_ECH_KEYS> keys = MakeTestECHKeys();
  ASSERT_TRUE(keys);
  ASSERT_TRUE(SSL_CTX_set1_ech_keys(server_ctx.get(), keys.get()));

  bssl::UniquePtr<SSL_CTX> client_ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(client_ctx);
  bssl::UniquePtr<SSL> client, server;
  ASSERT_TRUE(CreateClientAndServer(&client, &server, client_ctx.get(),
                                    server_ctx.get()));
  ASSERT_TRUE(InstallECHConfigList(client.get(), keys.get()));
  ASSERT_TRUE(CompleteHandshakes(client.get(), server.get()));

  EXPECT_TRUE(SSL_ech_accepted(client.get()));
  EXPECT_TRUE(SSL_ech_accepted(server.get()));

  // An ECH server will fairly naturally record the inner ClientHello random,
  // but an ECH client may forget to update the random once ClientHelloInner is
  // selected.
  uint8_t client_random1[SSL3_RANDOM_SIZE];
  uint8_t client_random2[SSL3_RANDOM_SIZE];
  ASSERT_EQ(sizeof(client_random1),
            SSL_get_client_random(client.get(), client_random1,
                                  sizeof(client_random1)));
  ASSERT_EQ(sizeof(client_random2),
            SSL_get_client_random(server.get(), client_random2,
                                  sizeof(client_random2)));
  EXPECT_EQ(Bytes(client_random1), Bytes(client_random2));
}